

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmdPlugin.c
# Opt level: O2

int Abc_ManReadInteger(char *pFileName,char *pToken)

{
  int iVar1;
  Vec_Str_t *p;
  char *pcVar2;
  size_t sVar3;
  
  p = Abc_ManReadFile(pFileName);
  if (p == (Vec_Str_t *)0x0) {
    iVar1 = -1;
  }
  else {
    pcVar2 = strstr(p->pArray,pToken);
    if (pcVar2 == (char *)0x0) {
      iVar1 = -1;
    }
    else {
      sVar3 = strlen(pToken);
      iVar1 = atoi(pcVar2 + sVar3);
    }
    Vec_StrFree(p);
  }
  return iVar1;
}

Assistant:

int Abc_ManReadInteger( char * pFileName, char * pToken )
{
    int Result = -1;
    Vec_Str_t * vStr;
    char * pStr;
    vStr = Abc_ManReadFile( pFileName );
    if ( vStr == NULL )
        return -1;
    pStr = Vec_StrArray( vStr );
    pStr = strstr( pStr, pToken );
    if ( pStr != NULL )
        Result = atoi( pStr + strlen(pToken) );
    Vec_StrFree( vStr );
    return Result;
}